

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O0

void __thiscall
WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::~WorkerQueue(WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *this)

{
  bool bVar1;
  reference this_00;
  thread *worker;
  iterator __end2;
  iterator __begin2;
  deque<std::thread,_std::allocator<std::thread>_> *__range2;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  std::atomic<bool>::operator=((atomic<bool> *)(this + 0xa8),true);
  std::condition_variable::notify_all();
  std::deque<std::thread,_std::allocator<std::thread>_>::begin
            ((iterator *)&__end2._M_node,(deque<std::thread,_std::allocator<std::thread>_> *)this);
  std::deque<std::thread,_std::allocator<std::thread>_>::end
            ((iterator *)&worker,(deque<std::thread,_std::allocator<std::thread>_> *)this);
  while (bVar1 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&worker), bVar1) {
    this_00 = std::_Deque_iterator<std::thread,_std::thread_&,_std::thread_*>::operator*
                        ((_Deque_iterator<std::thread,_std::thread_&,_std::thread_*> *)
                         &__end2._M_node);
    bVar1 = std::thread::joinable(this_00);
    if (bVar1) {
      std::thread::join();
    }
    std::_Deque_iterator<std::thread,_std::thread_&,_std::thread_*>::operator++
              ((_Deque_iterator<std::thread,_std::thread_&,_std::thread_*> *)&__end2._M_node);
  }
  std::
  deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::~deque((deque<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
            *)(this + 0x110));
  std::
  queue<std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_std::deque<std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_std::allocator<std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>_>_>_>
  ::~queue((queue<std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_std::deque<std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_std::allocator<std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>_>_>_>
            *)(this + 0xb0));
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x50));
  std::deque<std::thread,_std::allocator<std::thread>_>::~deque
            ((deque<std::thread,_std::allocator<std::thread>_> *)this);
  return;
}

Assistant:

~WorkerQueue() {
    mStop = true;
    mCondition.notify_all();
    for( auto& worker : mWorkers ) {
      if( worker.joinable() ) {
        worker.join();
      }
    }
  }